

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManChoiceLevel(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  Gia_ManCleanLevels(p,p->nObjs);
  Gia_ManIncrementTravId(p);
  iVar4 = 0;
  iVar2 = 0;
  while ((iVar4 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar4), pGVar3 != (Gia_Obj_t *)0x0))) {
    Gia_ManChoiceLevel_rec(p,pGVar3);
    iVar1 = Gia_ObjLevel(p,pGVar3);
    if (iVar2 < iVar1) {
      iVar2 = Gia_ObjLevel(p,pGVar3);
    }
    iVar4 = iVar4 + 1;
  }
  iVar4 = 0;
  while ((iVar4 < p->vCis->nSize && (pGVar3 = Gia_ManCi(p,iVar4), pGVar3 != (Gia_Obj_t *)0x0))) {
    Gia_ManChoiceLevel_rec(p,pGVar3);
    iVar1 = Gia_ObjLevel(p,pGVar3);
    if (iVar2 < iVar1) {
      iVar2 = Gia_ObjLevel(p,pGVar3);
    }
    iVar4 = iVar4 + 1;
  }
  iVar4 = 0;
  while( true ) {
    if (p->nObjs <= iVar4) {
      return iVar2;
    }
    pGVar3 = Gia_ManObj(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) &&
       (iVar1 = Gia_ObjLevel(p,pGVar3), iVar1 < 1)) {
      __assert_fail("Gia_ObjLevel(p, pObj) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x2f1,"int Gia_ManChoiceLevel(Gia_Man_t *)");
    }
    iVar4 = iVar4 + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManChoiceLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, LevelMax = 0;
//    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
    }
    // account for dangling boxes
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
//        Abc_Print( 1, "%d ", Gia_ObjLevel(p, pObj) );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
        assert( Gia_ObjLevel(p, pObj) > 0 );
//    printf( "Max level %d\n", LevelMax );
    return LevelMax;
}